

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poller.cpp
# Opt level: O0

int __thiscall hwnet::Poller::Add(Poller *this,Ptr *channel,int flag)

{
  bool bVar1;
  element_type *peVar2;
  mapped_type *this_00;
  int local_64;
  int local_60;
  undefined4 local_5c;
  int ret;
  int local_3c;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<hwnet::Channel>_>,_false> local_38;
  lock_guard<std::mutex> local_30;
  lock_guard<std::mutex> guard;
  int flag_local;
  Ptr *channel_local;
  Poller *this_local;
  
  guard._M_device._4_4_ = flag;
  std::lock_guard<std::mutex>::lock_guard(&local_30,&this->mtx);
  peVar2 = std::__shared_ptr_access<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)channel);
  local_3c = (*peVar2->_vptr_Channel[1])();
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_std::shared_ptr<hwnet::Channel>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<hwnet::Channel>_>_>_>
       ::find(&this->channels,&local_3c);
  _ret = (__node_type *)
         std::
         unordered_map<int,_std::shared_ptr<hwnet::Channel>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<hwnet::Channel>_>_>_>
         ::end(&this->channels);
  bVar1 = std::__detail::operator!=
                    (&local_38,
                     (_Node_iterator_base<std::pair<const_int,_std::shared_ptr<hwnet::Channel>_>,_false>
                      *)&ret);
  if (bVar1) {
    this_local._4_4_ = -1;
  }
  else {
    local_60 = Epoll::Add(&this->poller_,channel,guard._M_device._4_4_);
    if (local_60 == 0) {
      peVar2 = std::__shared_ptr_access<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)channel);
      local_64 = (*peVar2->_vptr_Channel[1])();
      this_00 = std::
                unordered_map<int,_std::shared_ptr<hwnet::Channel>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<hwnet::Channel>_>_>_>
                ::operator[](&this->channels,&local_64);
      std::shared_ptr<hwnet::Channel>::operator=(this_00,channel);
    }
    this_local._4_4_ = local_60;
  }
  local_5c = 1;
  std::lock_guard<std::mutex>::~lock_guard(&local_30);
  return this_local._4_4_;
}

Assistant:

int Poller::Add(const Channel::Ptr &channel,int flag) {
	std::lock_guard<std::mutex> guard(this->mtx);
	if(this->channels.find(channel->Fd()) != this->channels.end()) {
		return -1;
	} else {
		int ret = poller_.Add(channel,flag);
		if(0 == ret) {
			this->channels[channel->Fd()] = channel;
		}
		return ret;
	}
}